

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonExtractFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  Mem *pMVar1;
  void *pvVar2;
  JsonParse *pParse;
  byte *pbVar3;
  JsonNode *pJVar4;
  uchar *zPath;
  size_t sVar5;
  sqlite3_value **extraout_RDX;
  undefined8 extraout_RDX_00;
  sqlite3_value **extraout_RDX_01;
  sqlite3_value **aReplace;
  ulong uVar6;
  bool bVar7;
  JsonString jx;
  
  if (1 < argc) {
    pvVar2 = ctx->pFunc->pUserData;
    pParse = jsonParseCached(ctx,argv,ctx);
    if (pParse != (JsonParse *)0x0) {
      if (argc == 2) {
        pbVar3 = sqlite3_value_text(argv[1]);
        if (pbVar3 != (byte *)0x0) {
          if (((ulong)pvVar2 & 3) == 0) {
            pJVar4 = jsonLookup(pParse,(char *)pbVar3,(int *)0x0,ctx);
            bVar7 = pParse->nErr == '\0';
            if (pJVar4 != (JsonNode *)0x0 && bVar7) {
              jsonReturn(pJVar4,ctx,
                         (sqlite3_value **)
                         CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),
                                  pJVar4 != (JsonNode *)0x0 && bVar7));
              return;
            }
          }
          else {
            if (*pbVar3 == 0x24) {
              pJVar4 = jsonLookup(pParse,(char *)pbVar3,(int *)0x0,ctx);
              aReplace = extraout_RDX;
            }
            else {
              jx.zBuf = jx.zSpace;
              jx.nAlloc = 100;
              jx.nUsed = 0;
              jx.bStatic = '\x01';
              jx.bErr = '\0';
              if ((ulong)*pbVar3 - 0x3a < 0xfffffffffffffff6) {
                jx.pCtx = ctx;
                jsonAppendRaw(&jx,"$.",(*pbVar3 != 0x5b) + 1);
                sVar5 = strlen((char *)pbVar3);
                jsonAppendRaw(&jx,(char *)pbVar3,(u32)sVar5);
                jsonAppendChar(&jx,'\0');
              }
              else {
                jx.pCtx = ctx;
                jsonAppendRaw(&jx,"$[",2);
                sVar5 = strlen((char *)pbVar3);
                jsonAppendRaw(&jx,(char *)pbVar3,(u32)sVar5);
                jsonAppendRaw(&jx,"]",2);
              }
              if (jx.bErr == '\0') {
                pJVar4 = jsonLookup(pParse,jx.zBuf,(int *)0x0,ctx);
              }
              else {
                pJVar4 = (JsonNode *)0x0;
              }
              jsonReset(&jx);
              aReplace = extraout_RDX_01;
            }
            if (pJVar4 != (JsonNode *)0x0) {
              if (((ulong)pvVar2 & 1) == 0) {
                jsonReturn(pJVar4,ctx,aReplace);
                pMVar1 = ctx->pOut;
                pMVar1->eSubtype = '\0';
                pbVar3 = (byte *)((long)&pMVar1->flags + 1);
                *pbVar3 = *pbVar3 | 8;
              }
              else {
                jsonReturnJson(pJVar4,ctx,(sqlite3_value **)0x0);
              }
            }
          }
        }
      }
      else {
        jx.zBuf = jx.zSpace;
        jx.nAlloc = 100;
        jx.nUsed = 0;
        jx.bStatic = '\x01';
        jx.bErr = '\0';
        jx.pCtx = ctx;
        jsonAppendChar(&jx,'[');
        for (uVar6 = 1; (uint)argc != uVar6; uVar6 = uVar6 + 1) {
          zPath = sqlite3_value_text(argv[uVar6]);
          pJVar4 = jsonLookup(pParse,(char *)zPath,(int *)0x0,ctx);
          if (pParse->nErr != '\0') {
            if (argc != (int)uVar6) goto LAB_001be5de;
            break;
          }
          jsonAppendSeparator(&jx);
          if (pJVar4 == (JsonNode *)0x0) {
            jsonAppendRaw(&jx,"null",4);
          }
          else {
            jsonRenderNode(pJVar4,&jx,(sqlite3_value **)0x0);
          }
        }
        jsonAppendChar(&jx,']');
        jsonResult(&jx);
        pMVar1 = ctx->pOut;
        pMVar1->eSubtype = 'J';
        pbVar3 = (byte *)((long)&pMVar1->flags + 1);
        *pbVar3 = *pbVar3 | 8;
LAB_001be5de:
        jsonReset(&jx);
      }
    }
  }
  return;
}

Assistant:

static void jsonExtractFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  JsonNode *pNode;
  const char *zPath;
  int flags = SQLITE_PTR_TO_INT(sqlite3_user_data(ctx));
  JsonString jx;

  if( argc<2 ) return;
  p = jsonParseCached(ctx, argv, ctx);
  if( p==0 ) return;
  if( argc==2 ){
    /* With a single PATH argument */
    zPath = (const char*)sqlite3_value_text(argv[1]);
    if( zPath==0 ) return;
    if( flags & JSON_ABPATH ){
      if( zPath[0]!='$' ){
        /* The -> and ->> operators accept abbreviated PATH arguments.  This
        ** is mostly for compatibility with PostgreSQL, but also for
        ** convenience.
        **
        **     NUMBER   ==>  $[NUMBER]     // PG compatible
        **     LABEL    ==>  $.LABEL       // PG compatible
        **     [NUMBER] ==>  $[NUMBER]     // Not PG.  Purely for convenience
        */
        jsonInit(&jx, ctx);
        if( sqlite3Isdigit(zPath[0]) ){
          jsonAppendRaw(&jx, "$[", 2);
          jsonAppendRaw(&jx, zPath, (int)strlen(zPath));
          jsonAppendRaw(&jx, "]", 2);
        }else{
          jsonAppendRaw(&jx, "$.", 1 + (zPath[0]!='['));
          jsonAppendRaw(&jx, zPath, (int)strlen(zPath));
          jsonAppendChar(&jx, 0);
        }
        pNode = jx.bErr ? 0 : jsonLookup(p, jx.zBuf, 0, ctx);
        jsonReset(&jx);
      }else{
        pNode = jsonLookup(p, zPath, 0, ctx);
      }
      if( pNode ){
        if( flags & JSON_JSON ){
          jsonReturnJson(pNode, ctx, 0);
        }else{
          jsonReturn(pNode, ctx, 0);
          sqlite3_result_subtype(ctx, 0);
        }
      }
    }else{
      pNode = jsonLookup(p, zPath, 0, ctx);
      if( p->nErr==0 && pNode ) jsonReturn(pNode, ctx, 0);
    }
  }else{
    /* Two or more PATH arguments results in a JSON array with each
    ** element of the array being the value selected by one of the PATHs */
    int i;
    jsonInit(&jx, ctx);
    jsonAppendChar(&jx, '[');
    for(i=1; i<argc; i++){
      zPath = (const char*)sqlite3_value_text(argv[i]);
      pNode = jsonLookup(p, zPath, 0, ctx);
      if( p->nErr ) break;
      jsonAppendSeparator(&jx);
      if( pNode ){
        jsonRenderNode(pNode, &jx, 0);
      }else{
        jsonAppendRaw(&jx, "null", 4);
      }
    }
    if( i==argc ){
      jsonAppendChar(&jx, ']');
      jsonResult(&jx);
      sqlite3_result_subtype(ctx, JSON_SUBTYPE);
    }
    jsonReset(&jx);
  }
}